

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

string * strfmt<char>(string *__return_storage_ptr__,char *format,char *args)

{
  char cVar1;
  size_t sVar2;
  char *__s;
  stringstream ss;
  char local_1b1;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  __s = format + 2;
  do {
    cVar1 = __s[-2];
    if (cVar1 == '{') {
      if (__s[-1] == '}') {
        local_1b1 = *args;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,__s,sVar2);
LAB_001155de:
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream(local_1b0);
        std::ios_base::~ios_base(local_130);
        return __return_storage_ptr__;
      }
    }
    else if (cVar1 == '\0') goto LAB_001155de;
    local_1b1 = cVar1;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
    __s = __s + 1;
  } while( true );
}

Assistant:

inline std::string strfmt(const char *format, const Args&... args) {
    std::stringstream ss;
    printfmt(ss, format, args...);
    return ss.str();
}